

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createUndefFunctionCall
          (LLVMPointerGraphBuilder *this,CallInst *CInst,Function *func)

{
  StringRef RHS;
  StringRef RHS_00;
  StringRef RHS_01;
  StringRef RHS_02;
  StringRef RHS_03;
  StringRef RHS_04;
  StringRef RHS_05;
  bool bVar1;
  AllocationFunction AVar2;
  AnalysisOptions *this_00;
  Function *in_RCX;
  LLVMPointerGraphBuilder *in_RSI;
  PSNodesSeq *in_RDI;
  uint64_t lenVal;
  Value *src;
  Value *dest;
  StringRef *funname;
  AllocationFunction type;
  PSNode *in_stack_fffffffffffffe38;
  PSNode *in_stack_fffffffffffffe40;
  Instruction *in_stack_fffffffffffffe48;
  PSNode *this_01;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  initializer_list<dg::pta::PSNode_*> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  PSNodesSeq *CInst_00;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 uVar3;
  LLVMPointerGraphBuilder *in_stack_fffffffffffffe88;
  Instruction *in_stack_fffffffffffffea0;
  LLVMPointerGraphBuilder *in_stack_fffffffffffffea8;
  CallInst *in_stack_fffffffffffffeb0;
  LLVMPointerGraphBuilder *in_stack_fffffffffffffeb8;
  undefined1 local_108 [16];
  PSNode *local_f8;
  undefined1 local_f0 [16];
  string local_e0 [36];
  AllocationFunction local_bc;
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  undefined1 local_68 [16];
  PSNode *local_58;
  PSNode **local_50;
  __node_base local_48;
  undefined1 local_30 [16];
  Function *local_20;
  
  uVar3 = false;
  CInst_00 = in_RDI;
  local_20 = in_RCX;
  if (((byte)in_RSI[0x149] & 1) != 0) {
    local_30 = llvm::Value::getName();
    llvm::StringRef::StringRef
              ((StringRef *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               (char *)in_stack_fffffffffffffe48);
    RHS.Length._0_7_ = in_stack_fffffffffffffe50;
    RHS.Data = (char *)in_stack_fffffffffffffe48;
    RHS.Length._7_1_ = in_stack_fffffffffffffe57;
    uVar3 = llvm::StringRef::equals((StringRef *)in_stack_fffffffffffffe40,RHS);
  }
  if ((bool)uVar3 != false) {
    local_58 = createFree((LLVMPointerGraphBuilder *)
                          CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                          in_stack_fffffffffffffe48);
    local_50 = &local_58;
    local_48._M_nxt = (_Hash_node_base *)0x1;
    PSNodesSeq::PSNodesSeq
              ((PSNodesSeq *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    return CInst_00;
  }
  if (((byte)in_RSI[0x14a] & 1) != 0) {
    local_68 = llvm::Value::getName();
    llvm::StringRef::StringRef
              ((StringRef *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               (char *)in_stack_fffffffffffffe48);
    RHS_00.Length._0_7_ = in_stack_fffffffffffffe50;
    RHS_00.Data = (char *)in_stack_fffffffffffffe48;
    RHS_00.Length._7_1_ = in_stack_fffffffffffffe57;
    bVar1 = llvm::StringRef::equals((StringRef *)in_stack_fffffffffffffe40,RHS_00);
    if (bVar1) {
      createPthreadCreate(in_RSI,(CallInst *)CInst_00);
      return CInst_00;
    }
    local_88 = llvm::Value::getName();
    llvm::StringRef::StringRef
              ((StringRef *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               (char *)in_stack_fffffffffffffe48);
    RHS_01.Length._0_7_ = in_stack_fffffffffffffe50;
    RHS_01.Data = (char *)in_stack_fffffffffffffe48;
    RHS_01.Length._7_1_ = in_stack_fffffffffffffe57;
    bVar1 = llvm::StringRef::equals((StringRef *)in_stack_fffffffffffffe40,RHS_01);
    if (bVar1) {
      createPthreadJoin(in_stack_fffffffffffffe88,
                        (CallInst *)CONCAT17(uVar3,in_stack_fffffffffffffe80));
      return CInst_00;
    }
    local_a8._0_16_ = llvm::Value::getName();
    llvm::StringRef::StringRef
              ((StringRef *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               (char *)in_stack_fffffffffffffe48);
    RHS_02.Length._0_7_ = in_stack_fffffffffffffe50;
    RHS_02.Data = (char *)in_stack_fffffffffffffe48;
    RHS_02.Length._7_1_ = in_stack_fffffffffffffe57;
    bVar1 = llvm::StringRef::equals((StringRef *)in_stack_fffffffffffffe40,RHS_02);
    if (bVar1) {
      createPthreadExit(in_stack_fffffffffffffe88,
                        (CallInst *)CONCAT17(uVar3,in_stack_fffffffffffffe80));
      return CInst_00;
    }
  }
  this_00 = (AnalysisOptions *)(in_RSI + 0xf8);
  local_f0 = llvm::Value::getName();
  llvm::StringRef::str_abi_cxx11_((StringRef *)in_RDI);
  AVar2 = AnalysisOptions::getAllocationFunction
                    (this_00,(string *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50)
                    );
  std::__cxx11::string::~string(local_e0);
  local_bc = AVar2;
  if (AVar2 == NONE) {
    bVar1 = llvm::Function::isIntrinsic(local_20);
    if (bVar1) {
      createIntrinsic(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    }
    else {
      local_108 = llvm::Value::getName();
      this_01 = (PSNode *)local_108;
      local_f8 = this_01;
      llvm::StringRef::StringRef
                ((StringRef *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 (char *)this_01);
      RHS_03.Length._0_7_ = in_stack_fffffffffffffe50;
      RHS_03.Data = (char *)this_01;
      RHS_03.Length._7_1_ = in_stack_fffffffffffffe57;
      bVar1 = llvm::StringRef::equals((StringRef *)in_stack_fffffffffffffe40,RHS_03);
      uVar3 = true;
      if (!bVar1) {
        in_stack_fffffffffffffe40 = local_f8;
        llvm::StringRef::StringRef
                  ((StringRef *)CONCAT17(1,in_stack_fffffffffffffe50),(char *)this_01);
        RHS_04.Length._0_7_ = in_stack_fffffffffffffe50;
        RHS_04.Data = (char *)this_01;
        RHS_04.Length._7_1_ = uVar3;
        bVar1 = llvm::StringRef::equals((StringRef *)in_stack_fffffffffffffe40,RHS_04);
        uVar3 = true;
        if (!bVar1) {
          in_stack_fffffffffffffe38 = local_f8;
          llvm::StringRef::StringRef
                    ((StringRef *)CONCAT17(1,in_stack_fffffffffffffe50),(char *)this_01);
          RHS_05.Length._0_7_ = in_stack_fffffffffffffe50;
          RHS_05.Data = (char *)this_01;
          RHS_05.Length._7_1_ = uVar3;
          uVar3 = llvm::StringRef::equals((StringRef *)in_stack_fffffffffffffe40,RHS_05);
        }
      }
      if ((bool)uVar3 == false) {
        createUnknownCall((LLVMPointerGraphBuilder *)in_stack_fffffffffffffe40);
        PSNodesSeq::PSNodesSeq
                  ((PSNodesSeq *)CONCAT44(AVar2,in_stack_fffffffffffffe60),
                   (initializer_list<dg::pta::PSNode_*> *)this_00);
      }
      else {
        llvm::CallBase::getOperand
                  ((CallBase *)in_stack_fffffffffffffe40,
                   (uint)((ulong)in_stack_fffffffffffffe38 >> 0x20));
        llvm::CallBase::getOperand
                  ((CallBase *)in_stack_fffffffffffffe40,
                   (uint)((ulong)in_stack_fffffffffffffe38 >> 0x20));
        llvm::CallBase::getOperand
                  ((CallBase *)in_stack_fffffffffffffe40,
                   (uint)((ulong)in_stack_fffffffffffffe38 >> 0x20));
        llvmutils::getConstantValue((Value *)in_stack_fffffffffffffe40);
        getOperand((LLVMPointerGraphBuilder *)this_01,(Value *)in_stack_fffffffffffffe40);
        getOperand((LLVMPointerGraphBuilder *)this_01,(Value *)in_stack_fffffffffffffe40);
        PointerGraph::
        create<(dg::pta::PSNodeType)20,dg::pta::PSNode*,dg::pta::PSNode*,unsigned_long&>
                  ((PointerGraph *)CONCAT44(AVar2,in_stack_fffffffffffffe60),(PSNode **)this_00,
                   (PSNode **)CONCAT17(uVar3,in_stack_fffffffffffffe50),(unsigned_long *)this_01);
        PSNodesSeq::PSNodesSeq((PSNodesSeq *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      }
    }
  }
  else {
    createDynamicMemAlloc
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               (AllocationFunction)((ulong)in_stack_fffffffffffffea8 >> 0x20));
  }
  return CInst_00;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createUndefFunctionCall(const llvm::CallInst *CInst,
                                                 const llvm::Function *func) {
    assert(func->empty());
    // is it a call to free? If so, create invalidate node instead.
    if (invalidate_nodes && func->getName().equals("free")) {
        return {createFree(CInst)};
    }
    if (threads_) {
        if (func->getName().equals("pthread_create")) {
            return createPthreadCreate(CInst);
        }
        if (func->getName().equals("pthread_join")) {
            return createPthreadJoin(CInst);
        }
        if (func->getName().equals("pthread_exit")) {
            return createPthreadExit(CInst);
        }
    }
    /// memory allocation (malloc, calloc, etc.)
    auto type = _options.getAllocationFunction(func->getName().str());
    if (type != AllocationFunction::NONE) {
        return createDynamicMemAlloc(CInst, type);
    }
    if (func->isIntrinsic()) {
        return createIntrinsic(CInst);
    }

    // mempy/memmove
    const auto &funname = func->getName();
    if (funname.equals("memcpy") || funname.equals("__memcpy_chk") ||
        funname.equals("memove")) {
        auto *dest = CInst->getOperand(0);
        auto *src = CInst->getOperand(1);
        auto lenVal = llvmutils::getConstantValue(CInst->getOperand(2));
        return PS.create<PSNodeType::MEMCPY>(getOperand(src), getOperand(dest),
                                             lenVal);
    }

    return {createUnknownCall()};
}